

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

QMenu * __thiscall
QWidgetTextControl::createStandardContextMenu(QWidgetTextControl *this,QPointF *pos,QWidget *parent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  Int IVar6;
  ulong uVar7;
  QGuiApplicationPrivate *pQVar8;
  QAction *pQVar9;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  QUnicodeControlCharacterMenu *ctrlCharacterMenu;
  QAction *a;
  QMenu *menu;
  bool showTextSelectionActions;
  QWidgetTextControlPrivate *d;
  char16_t *str_8;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_13;
  char16_t *str_10;
  char16_t *str_9;
  char16_t *str_12;
  char16_t *str_11;
  char16_t *str_14;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffff4c8;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffff4d0;
  QFlagsStorage<Qt::TextInteractionFlag> in_stack_fffffffffffff4d8;
  uint in_stack_fffffffffffff4dc;
  QUnicodeControlCharacterMenu *in_stack_fffffffffffff4e0;
  ConnectionType type;
  QUnicodeControlCharacterMenu *in_stack_fffffffffffff4e8;
  QObject *in_stack_fffffffffffff4f0;
  QGuiApplicationPrivate *in_stack_fffffffffffff4f8;
  QWidget *in_stack_fffffffffffff500;
  QWidget *this_00;
  QWidget *local_980;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_80c;
  QArrayDataPointer<char16_t> local_808 [2];
  QArrayDataPointer<char16_t> local_7d8 [2];
  QKeySequence local_7a8 [8];
  undefined1 local_7a0 [30];
  undefined2 local_782;
  QKeySequence local_760 [128];
  QArrayDataPointer<char16_t> local_6e0 [2];
  QArrayDataPointer<char16_t> local_6b0 [3];
  QArrayDataPointer<char16_t> local_668 [2];
  QArrayDataPointer<char16_t> local_638 [2];
  QKeySequence local_608 [8];
  undefined1 local_600 [30];
  undefined2 local_5e2;
  QKeySequence local_5c0 [132];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_53c;
  QArrayDataPointer<char16_t> local_538 [3];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_4f0;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_4ec;
  QArrayDataPointer<char16_t> local_4e8 [2];
  QArrayDataPointer<char16_t> local_4b8 [2];
  QKeySequence local_488 [8];
  undefined1 local_480 [30];
  undefined2 local_462;
  QKeySequence local_440 [128];
  QArrayDataPointer<char16_t> local_3c0 [2];
  QArrayDataPointer<char16_t> local_390 [2];
  QKeySequence local_360 [8];
  undefined1 local_358 [30];
  undefined2 local_33a;
  QKeySequence local_318 [128];
  QArrayDataPointer<char16_t> local_298 [2];
  QArrayDataPointer<char16_t> local_268 [2];
  QKeySequence local_238 [8];
  undefined1 local_230 [30];
  undefined2 local_212;
  QKeySequence local_1f0 [128];
  QArrayDataPointer<char16_t> local_170 [2];
  QArrayDataPointer<char16_t> local_140 [2];
  QKeySequence local_110 [8];
  undefined1 local_108 [30];
  undefined2 local_ea;
  QKeySequence local_c8 [132];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_44;
  undefined1 local_40 [48];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_10;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidgetTextControl *)0x71a429);
  local_10.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       Qt::operator|((enum_type)((ulong)in_stack_fffffffffffff4d0 >> 0x20),
                     (enum_type)in_stack_fffffffffffff4d0);
  QFlags<Qt::TextInteractionFlag>::operator|
            ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
             (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                  (QFlags<Qt::TextInteractionFlag>)in_stack_fffffffffffff4d8.i);
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  bVar10 = IVar6 != 0;
  QString::QString((QString *)0x71a4ba);
  QString::operator=(&in_stack_fffffffffffff4d0->a,&in_stack_fffffffffffff4c8->a);
  QString::~QString((QString *)0x71a4e3);
  bVar4 = QPointF::isNull((QPointF *)in_stack_fffffffffffff4d0);
  if (!bVar4) {
    (**(code **)(*in_RDI + 0x70))(local_40,in_RDI,in_RSI);
    QString::operator=(&in_stack_fffffffffffff4d0->a,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71a53b);
  }
  bVar4 = QString::isEmpty((QString *)0x71a54f);
  if ((bVar4) && (!bVar10)) {
    local_980 = (QWidget *)0x0;
    goto LAB_0071c033;
  }
  local_980 = (QWidget *)operator_new(0x28);
  QMenu::QMenu((QMenu *)in_stack_fffffffffffff4f0,(QWidget *)in_stack_fffffffffffff4e8);
  local_44.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                  (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
  if (IVar6 != 0) {
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_c8,Undo);
      bVar3 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_0071a70e;
      local_ea = 9;
      QKeySequence::QKeySequence(local_110,Undo);
      bVar2 = true;
      QKeySequence::toString((SequenceFormat)local_108);
      bVar1 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071a70e:
      QString::QString((QString *)0x71a71b);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71a789);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71a7a3);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71a7bc);
    }
    if (bVar1) {
      QString::~QString((QString *)0x71a7d5);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_110);
    }
    if (bVar3) {
      QKeySequence::~QKeySequence(local_c8);
    }
    QString::~QString((QString *)0x71a814);
    QTextDocument::isUndoAvailable();
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_140,(Data *)0x0,L"edit-undo",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71a8dc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_170,(Data *)0x0,L"edit-undo",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71a97d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_1f0,Redo);
      bVar3 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_0071aaae;
      local_212 = 9;
      QKeySequence::QKeySequence(local_238,Redo);
      bVar2 = true;
      QKeySequence::toString((SequenceFormat)local_230);
      bVar1 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071aaae:
      QString::QString((QString *)0x71aabb);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71ab29);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71ab43);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71ab5c);
    }
    if (bVar1) {
      QString::~QString((QString *)0x71ab75);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_238);
    }
    if (bVar3) {
      QKeySequence::~QKeySequence(local_1f0);
    }
    QString::~QString((QString *)0x71abb4);
    QTextDocument::isRedoAvailable();
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_268,(Data *)0x0,L"edit-redo",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71ac7c);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_298,(Data *)0x0,L"edit-redo",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71ad1d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QMenu::addSeparator(&in_stack_fffffffffffff4e0->super_QMenu);
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_318,Cut);
      bVar3 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_0071ae5b;
      local_33a = 9;
      QKeySequence::QKeySequence(local_360,Cut);
      bVar2 = true;
      QKeySequence::toString((SequenceFormat)local_358);
      bVar1 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071ae5b:
      QString::QString((QString *)0x71ae68);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71aed6);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71aef0);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71af09);
    }
    if (bVar1) {
      QString::~QString((QString *)0x71af22);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_360);
    }
    if (bVar3) {
      QKeySequence::~QKeySequence(local_318);
    }
    QString::~QString((QString *)0x71af61);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_390,(Data *)0x0,L"edit-cut",8);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71b02c);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_3c0,(Data *)0x0,L"edit-cut",8);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71b0cd);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
  }
  if (bVar10) {
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_440,Copy);
      bVar3 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_0071b20c;
      local_462 = 9;
      QKeySequence::QKeySequence(local_488,Copy);
      bVar2 = true;
      QKeySequence::toString((SequenceFormat)local_480);
      bVar1 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071b20c:
      QString::QString((QString *)0x71b219);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71b287);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71b2a1);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71b2ba);
    }
    if (bVar1) {
      QString::~QString((QString *)0x71b2d3);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_488);
    }
    if (bVar3) {
      QKeySequence::~QKeySequence(local_440);
    }
    QString::~QString((QString *)0x71b312);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_4b8,(Data *)0x0,L"edit-copy",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71b3dd);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_4e8,(Data *)0x0,L"edit-copy",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71b47e);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
  }
  local_4ec.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                  (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4ec);
  bVar4 = true;
  if (IVar6 == 0) {
    local_4f0.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
         (QFlagsStorage<Qt::TextInteractionFlag>)
         QFlags<Qt::TextInteractionFlag>::operator&
                   ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                    (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_4f0);
    bVar4 = IVar6 != 0;
  }
  if (bVar4) {
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71b57b);
    QString::isEmpty((QString *)0x71b59f);
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_538,(Data *)0x0,L"link-copy",9);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71b648);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
  }
  local_53c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                  (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_53c);
  if (IVar6 != 0) {
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_5c0,Paste);
      bVar3 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_0071b7a9;
      local_5e2 = 9;
      QKeySequence::QKeySequence(local_608,Paste);
      bVar2 = true;
      QKeySequence::toString((SequenceFormat)local_600);
      bVar1 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071b7a9:
      QString::QString((QString *)0x71b7b6);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71b824);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71b83e);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71b857);
    }
    if (bVar1) {
      QString::~QString((QString *)0x71b870);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_608);
    }
    if (bVar3) {
      QKeySequence::~QKeySequence(local_5c0);
    }
    QString::~QString((QString *)0x71b8af);
    canPaste((QWidgetTextControl *)in_stack_fffffffffffff4e0);
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_638,(Data *)0x0,L"edit-paste",10);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71b967);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_668,(Data *)0x0,L"edit-paste",10);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71ba02);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    pQVar9 = QWidget::addAction(in_stack_fffffffffffff500,(QString *)in_stack_fffffffffffff4f8,
                                in_stack_fffffffffffff4f0,(char *)in_stack_fffffffffffff4e8,
                                (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
    QString::~QString((QString *)0x71ba72);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_6b0,(Data *)0x0,L"edit-delete",0xb);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71bb31);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_6e0,(Data *)0x0,L"edit-delete",0xb);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71bbcc);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
  }
  if (bVar10) {
    QMenu::addSeparator(&in_stack_fffffffffffff4e0->super_QMenu);
    type = (ConnectionType)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
    this_00 = local_980;
    tr((char *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
       (char *)in_stack_fffffffffffff4d0,(int)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar2 = false;
    bVar1 = false;
    bVar10 = false;
    bVar4 = false;
    if ((uVar7 & 1) == 0) {
      in_stack_fffffffffffff4f8 = QGuiApplicationPrivate::instance();
      in_stack_fffffffffffff4f8 = in_stack_fffffffffffff4f8 + 0x140;
      QKeySequence::QKeySequence(local_760,SelectAll);
      bVar2 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)in_stack_fffffffffffff4f8);
      if ((uVar7 & 1) != 0) goto LAB_0071bd0f;
      local_782 = 9;
      QKeySequence::QKeySequence(local_7a8,SelectAll);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_7a0);
      bVar10 = true;
      ::operator+((char16_t *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                  &in_stack_fffffffffffff4d0->a);
      bVar4 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffff4c8);
    }
    else {
LAB_0071bd0f:
      QString::QString((QString *)0x71bd1c);
    }
    ::operator+((QString *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i),
                &in_stack_fffffffffffff4d0->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff4c8);
    in_stack_fffffffffffff4e8 =
         (QUnicodeControlCharacterMenu *)
         QWidget::addAction(this_00,(QString *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                            (char *)in_stack_fffffffffffff4e8,type);
    QString::~QString((QString *)0x71bd87);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffff4d0);
    QString::~QString((QString *)0x71bda1);
    if (bVar4) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x71bdba);
    }
    if (bVar10) {
      QString::~QString((QString *)0x71bdd3);
    }
    if (bVar1) {
      QKeySequence::~QKeySequence(local_7a8);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_760);
    }
    QString::~QString((QString *)0x71be12);
    in_stack_fffffffffffff4e0 = in_stack_fffffffffffff4e8;
    QTextDocument::isEmpty();
    QAction::setEnabled(SUB81(in_stack_fffffffffffff4e0,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_7d8,(Data *)0x0,L"select-all",10);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    QObject::setObjectName<void>((QObject *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a)
    ;
    QString::~QString((QString *)0x71bed0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_808,(Data *)0x0,L"edit-select-all",0xf);
    QString::QString(&in_stack_fffffffffffff4d0->a,(DataPointer *)in_stack_fffffffffffff4c8);
    setActionIcon((QAction *)in_stack_fffffffffffff4d0,&in_stack_fffffffffffff4c8->a);
    QString::~QString((QString *)0x71bf6b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff4d0);
  }
  local_80c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_stack_fffffffffffff4d0,
                  (TextInteractionFlag)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  IVar6 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_80c);
  in_stack_fffffffffffff4dc = in_stack_fffffffffffff4dc & 0xffffff;
  if (IVar6 != 0) {
    QGuiApplication::styleHints();
    uVar5 = QStyleHints::useRtlExtensions();
    in_stack_fffffffffffff4dc = CONCAT13(uVar5,(int3)in_stack_fffffffffffff4dc);
  }
  if ((in_stack_fffffffffffff4dc & 0x1000000) != 0) {
    QMenu::addSeparator(&in_stack_fffffffffffff4e0->super_QMenu);
    operator_new(0x30);
    QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
              (in_stack_fffffffffffff4e8,(QObject *)in_stack_fffffffffffff4e0,
               (QWidget *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i));
    QMenu::addMenu(&in_stack_fffffffffffff4e0->super_QMenu,
                   (QMenu *)CONCAT44(in_stack_fffffffffffff4dc,in_stack_fffffffffffff4d8.i));
  }
LAB_0071c033:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QMenu *)local_980;
}

Assistant:

QMenu *QWidgetTextControl::createStandardContextMenu(const QPointF &pos, QWidget *parent)
{
    Q_D(QWidgetTextControl);

    const bool showTextSelectionActions = d->interactionFlags & (Qt::TextEditable | Qt::TextSelectableByKeyboard | Qt::TextSelectableByMouse);

    d->linkToCopy = QString();
    if (!pos.isNull())
        d->linkToCopy = anchorAt(pos);

    if (d->linkToCopy.isEmpty() && !showTextSelectionActions)
        return nullptr;

    QMenu *menu = new QMenu(parent);
    QAction *a;

    if (d->interactionFlags & Qt::TextEditable) {
        a = menu->addAction(tr("&Undo") + ACCEL_KEY(QKeySequence::Undo), this, SLOT(undo()));
        a->setEnabled(d->doc->isUndoAvailable());
        a->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(a, QStringLiteral("edit-undo"));
        a = menu->addAction(tr("&Redo") + ACCEL_KEY(QKeySequence::Redo), this, SLOT(redo()));
        a->setEnabled(d->doc->isRedoAvailable());
        a->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(a, QStringLiteral("edit-redo"));
        menu->addSeparator();

#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut), this, SLOT(cut()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(a, QStringLiteral("edit-cut"));
#endif
    }

#ifndef QT_NO_CLIPBOARD
    if (showTextSelectionActions) {
        a = menu->addAction(tr("&Copy") + ACCEL_KEY(QKeySequence::Copy), this, SLOT(copy()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-copy"));
        setActionIcon(a, QStringLiteral("edit-copy"));
    }

    if ((d->interactionFlags & Qt::LinksAccessibleByKeyboard)
            || (d->interactionFlags & Qt::LinksAccessibleByMouse)) {

        a = menu->addAction(tr("Copy &Link Location"), this, SLOT(_q_copyLink()));
        a->setEnabled(!d->linkToCopy.isEmpty());
        a->setObjectName(QStringLiteral("link-copy"));
    }
#endif // QT_NO_CLIPBOARD

    if (d->interactionFlags & Qt::TextEditable) {
#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("&Paste") + ACCEL_KEY(QKeySequence::Paste), this, SLOT(paste()));
        a->setEnabled(canPaste());
        a->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(a, QStringLiteral("edit-paste"));
#endif
        a = menu->addAction(tr("Delete"), this, SLOT(_q_deleteSelected()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(a, QStringLiteral("edit-delete"));
    }


    if (showTextSelectionActions) {
        menu->addSeparator();
        a = menu->addAction(tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll), this, SLOT(selectAll()));
        a->setEnabled(!d->doc->isEmpty());
        a->setObjectName(QStringLiteral("select-all"));
        setActionIcon(a, QStringLiteral("edit-select-all"));
    }

    if ((d->interactionFlags & Qt::TextEditable) && QGuiApplication::styleHints()->useRtlExtensions()) {
        menu->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, menu);
        menu->addMenu(ctrlCharacterMenu);
    }

    return menu;
}